

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O0

void DISTRHO::fillInPredefinedPortGroupData(uint32_t groupId,PortGroup *portGroup)

{
  PortGroup *portGroup_local;
  uint32_t groupId_local;
  
  if (groupId == 0xfffffffd) {
    String::operator=(&portGroup->name,"Stereo");
    String::operator=(&portGroup->symbol,"dpf_stereo");
  }
  else if (groupId == 0xfffffffe) {
    String::operator=(&portGroup->name,"Mono");
    String::operator=(&portGroup->symbol,"dpf_mono");
  }
  else if (groupId == 0xffffffff) {
    String::clear(&portGroup->name);
    String::clear(&portGroup->symbol);
  }
  return;
}

Assistant:

static void fillInPredefinedPortGroupData(const uint32_t groupId, PortGroup& portGroup)
{
    switch (groupId)
    {
    case kPortGroupNone:
        portGroup.name.clear();
        portGroup.symbol.clear();
        break;
    case kPortGroupMono:
        portGroup.name = "Mono";
        portGroup.symbol = "dpf_mono";
        break;
    case kPortGroupStereo:
        portGroup.name = "Stereo";
        portGroup.symbol = "dpf_stereo";
        break;
    }
}